

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.H
# Opt level: O0

Array4<const_double> * __thiscall
amrex::MLLinOp::compactify<double_const>(MLLinOp *this,Array4<const_double> *a)

{
  undefined8 *in_RDX;
  long in_RSI;
  Array4<const_double> *in_RDI;
  Dim3 local_88;
  Dim3 local_7c;
  Dim3 local_70;
  Dim3 local_64;
  Dim3 local_58;
  Dim3 local_4c [6];
  
  if (*(int *)(in_RSI + 0x24) == 0) {
    local_4c[0].x = *(int *)((long)in_RDX + 0x24);
    local_4c[0].y = *(int *)(in_RDX + 5);
    local_4c[0].z = 0;
    local_58.x = *(int *)(in_RDX + 6);
    local_58.y = *(int *)((long)in_RDX + 0x34);
    local_58.z = 1;
    Array4<const_double>::Array4(in_RDI,(double *)*in_RDX,local_4c,&local_58,*(int *)(in_RDX + 7));
  }
  else if (*(int *)(in_RSI + 0x24) == 1) {
    local_64.x = *(int *)(in_RDX + 4);
    local_64.y = *(int *)(in_RDX + 5);
    local_64.z = 0;
    local_70.x = *(int *)((long)in_RDX + 0x2c);
    local_70.y = *(int *)((long)in_RDX + 0x34);
    local_70.z = 1;
    Array4<const_double>::Array4(in_RDI,(double *)*in_RDX,&local_64,&local_70,*(int *)(in_RDX + 7));
  }
  else if (*(int *)(in_RSI + 0x24) == 2) {
    local_7c.x = *(int *)(in_RDX + 4);
    local_7c.y = *(int *)((long)in_RDX + 0x24);
    local_7c.z = 0;
    local_88.x = *(int *)((long)in_RDX + 0x2c);
    local_88.y = *(int *)(in_RDX + 6);
    local_88.z = 1;
    Array4<const_double>::Array4(in_RDI,(double *)*in_RDX,&local_7c,&local_88,*(int *)(in_RDX + 7));
  }
  else {
    memcpy(in_RDI,in_RDX,0x40);
  }
  return in_RDI;
}

Assistant:

Array4<T> compactify (Array4<T> const& a) const noexcept
    {
        if (info.hidden_direction == 0) {
            return Array4<T>(a.dataPtr(), {a.begin.y,a.begin.z,0}, {a.end.y,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 1) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.z,0}, {a.end.x,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 2) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.y,0}, {a.end.x,a.end.y,1}, a.nComp());
        } else {
            return a;
        }
    }